

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# color.h
# Opt level: O3

void __thiscall
fmt::v7::vprint<char[33],char>
          (v7 *this,FILE *f,text_style *ts,char (*format) [33],
          basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          args)

{
  size_t sVar1;
  ulong uVar2;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  args_00;
  basic_string_view<char> format_str;
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> buf;
  buffer<char> local_248;
  char local_228 [504];
  
  local_248.size_ = 0;
  local_248._vptr_buffer = (_func_int **)&PTR_grow_007a24a8;
  local_248.capacity_ = 500;
  local_248.ptr_ = local_228;
  sVar1 = strlen((char *)ts);
  args_00.field_1 =
       (anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
        )(anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
          )args.desc_;
  args_00.desc_ = (unsigned_long_long)format;
  format_str.size_ = sVar1;
  format_str.data_ = (char *)ts;
  detail::vformat_to<char>(&local_248,(text_style *)f,format_str,args_00);
  uVar2 = local_248.size_ + 1;
  if (local_248.capacity_ < uVar2) {
    (**local_248._vptr_buffer)();
    uVar2 = local_248.size_ + 1;
  }
  local_248.ptr_[local_248.size_] = '\0';
  local_248.size_ = uVar2;
  fputs(local_248.ptr_,(FILE *)this);
  if (local_248.ptr_ != local_228) {
    operator_delete(local_248.ptr_,local_248.capacity_);
  }
  return;
}

Assistant:

void vprint(std::FILE* f, const text_style& ts, const S& format,
            basic_format_args<buffer_context<type_identity_t<Char>>> args) {
  basic_memory_buffer<Char> buf;
  detail::vformat_to(buf, ts, to_string_view(format), args);
  buf.push_back(Char(0));
  detail::fputs(buf.data(), f);
}